

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

json __thiscall nlohmann::json_schema::json_validator::validate(json_validator *this,json *instance)

{
  error_handler *in_RDX;
  json_value extraout_RDX;
  json jVar1;
  throwing_error_handler err;
  allocator<char> local_101;
  undefined1 local_100 [8];
  string local_f8;
  json_uri local_d8;
  
  local_100 = (undefined1  [8])&PTR__error_handler_001518b8;
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_100 + 8),"#",&local_101);
  json_uri::json_uri((json_uri *)(local_100 + 0x28),(string *)(local_100 + 8));
  validate(this,instance,in_RDX,(json_uri *)local_100);
  json_uri::~json_uri((json_uri *)(local_100 + 0x28));
  std::__cxx11::string::~string((string *)(local_100 + 8));
  jVar1.m_value.object = extraout_RDX.object;
  jVar1._0_8_ = this;
  return jVar1;
}

Assistant:

json json_validator::validate(const json &instance) const
{
	throwing_error_handler err;
	return validate(instance, err);
}